

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O2

void __thiscall gimage::TIFFImageIO::save(TIFFImageIO *this,ImageU8 *image,char *name)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  int iVar6;
  long lVar7;
  IOException *pIVar8;
  pointer puVar9;
  long i;
  long lVar10;
  long lVar11;
  long k;
  ulong uVar12;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  lVar7 = TIFFOpen(name,"w");
  if (lVar7 == 0) {
    pIVar8 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_48,name,(allocator *)&line);
    std::operator+(&local_80,"Cannot store image: ",&local_48);
    gutil::IOException::IOException(pIVar8,&local_80);
    __cxa_throw(pIVar8,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  TIFFSetField(lVar7,0x100,(int)image->width);
  TIFFSetField(lVar7,0x101,(int)image->height);
  TIFFSetField(lVar7,0x115,(short)image->depth);
  TIFFSetField(lVar7,0x102,8);
  TIFFSetField(lVar7,0x153,1);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)image->depth * image->width;
  auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x2000);
  uVar4 = SUB164(auVar2 / auVar1,0);
  if (uVar4 < 2) {
    uVar4 = 1;
  }
  uVar3 = (uint)image->height;
  if ((int)uVar4 < (int)uVar3) {
    uVar3 = uVar4;
  }
  uVar5 = TIFFDefaultStripSize(lVar7,uVar3,SUB168(auVar2 % auVar1,0));
  TIFFSetField(lVar7,0x116,uVar5);
  TIFFSetField(lVar7,0x112,1);
  TIFFSetField(lVar7,0x11c,1);
  TIFFSetField(lVar7,0x106,(image->depth - 3U < 2) + '\x01');
  if ((long)image->depth == 1) {
    uVar12 = 0;
    while ((long)uVar12 < image->height) {
      iVar6 = TIFFWriteScanline(lVar7,(*image->img)[uVar12],uVar12 & 0xffffffff,0);
      uVar12 = uVar12 + 1;
      if (iVar6 < 0) {
        TIFFClose(lVar7);
        pIVar8 = (IOException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_48,name,(allocator *)&line);
        std::operator+(&local_80,"Cannot write image data: ",&local_48);
        gutil::IOException::IOException(pIVar8,&local_80);
        __cxa_throw(pIVar8,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
      }
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&line,(long)image->depth * image->width,(allocator_type *)&local_80);
    uVar12 = 0;
    while ((long)uVar12 < image->height) {
      puVar9 = line.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar10 = 0; lVar10 < image->width; lVar10 = lVar10 + 1) {
        for (lVar11 = 0; lVar11 < image->depth; lVar11 = lVar11 + 1) {
          puVar9[lVar11] = image->img[lVar11][uVar12][lVar10];
        }
        puVar9 = puVar9 + lVar11;
      }
      iVar6 = TIFFWriteScanline(lVar7,line.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,uVar12 & 0xffffffff)
      ;
      uVar12 = uVar12 + 1;
      if (iVar6 < 0) {
        TIFFClose(lVar7);
        pIVar8 = (IOException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_48,name,&local_81);
        std::operator+(&local_80,"Cannot write image data: ",&local_48);
        gutil::IOException::IOException(pIVar8,&local_80);
        __cxa_throw(pIVar8,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
      }
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&line.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  TIFFClose(lVar7);
  return;
}

Assistant:

void TIFFImageIO::save(const ImageU8 &image, const char *name) const
{
  saveInternal(image, name);
}